

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

bool __thiscall
BackgroundParser::ParseBackgroundItem
          (BackgroundParser *this,Parser *parser,ParseNodeFnc *parseNode,bool isDeferred)

{
  ThreadContextId pvVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContextId pvVar4;
  undefined4 *puVar5;
  BackgroundParseItem *pBVar6;
  BackgroundParseItem *item;
  JobProcessor *this_00;
  BackgroundParseItem *backgroundItem;
  BasePtr<BackgroundParseItem> local_38;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> workItemAutoPtr;
  bool isDeferred_local;
  ParseNodeFnc *parseNode_local;
  Parser *parser_local;
  BackgroundParser *this_local;
  
  pvVar1 = this->mainThreadId;
  workItemAutoPtr.super_BasePtr<BackgroundParseItem>.ptr._7_1_ = isDeferred;
  pvVar4 = GetCurrentThreadContextId();
  if (pvVar1 != pvVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                       ,0xa1,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of BackgroundParser from thread other than the creating context\'s current thread"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pBVar6 = NewBackgroundParseItem
                     (this,parser,parseNode,
                      (bool)(workItemAutoPtr.super_BasePtr<BackgroundParseItem>.ptr._7_1_ & 1));
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator>::AutoPtr
            ((AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> *)&local_38,pBVar6);
  pBVar6 = BasePtr::operator_cast_to_BackgroundParseItem_((BasePtr *)&local_38);
  if (pBVar6 != (BackgroundParseItem *)0x0) {
    Parser::PrepareForBackgroundParse(parser);
    item = BasePtr<BackgroundParseItem>::Detach(&local_38);
    this_00 = JsUtil::JobManager::Processor((JobManager *)this);
    bVar3 = JsUtil::JobProcessor::ProcessesInBackground(this_00);
    AddToParseQueue(this,item,false,bVar3);
  }
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> *)&local_38);
  return pBVar6 != (BackgroundParseItem *)0x0;
}

Assistant:

bool BackgroundParser::ParseBackgroundItem(Parser *parser, ParseNodeFnc *parseNode, bool isDeferred)
{
    ASSERT_THREAD();

    AutoPtr<BackgroundParseItem> workItemAutoPtr(this->NewBackgroundParseItem(parser, parseNode, isDeferred));
    if ((BackgroundParseItem*) workItemAutoPtr == nullptr)
    {
        // OOM, just skip this work item and return.
        // TODO: Raise an OOM parse-time exception.
        return false;
    }

    parser->PrepareForBackgroundParse();

    BackgroundParseItem * backgroundItem = workItemAutoPtr.Detach();
    this->AddToParseQueue(backgroundItem, false, this->Processor()->ProcessesInBackground());

    return true;
}